

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

int czh::utils::get_string_edit_distance(string *s1,string *s2)

{
  char cVar1;
  int iVar2;
  _Vector_base<int,_std::allocator<int>_> *p_Var3;
  size_type __n;
  reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  int *piVar7;
  value_type local_94;
  int local_90;
  int left_down;
  int down;
  int left;
  int j_1;
  int i_1;
  int j;
  int i;
  allocator<int> local_61;
  vector<int,_std::allocator<int>_> local_60;
  undefined1 local_48 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  D;
  size_t m;
  size_t n;
  string *s2_local;
  string *s1_local;
  
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(s1);
  D.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(s2);
  if (__n * (long)D.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
    s1_local._4_4_ =
         (int)__n +
         (int)D.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    p_Var3 = &(D.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
              super__Vector_base<int,_std::allocator<int>_>;
    std::allocator<int>::allocator(&local_61);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_60,(size_type)((long)&(p_Var3->_M_impl).super__Vector_impl_data._M_start + 1),
               &local_61);
    std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
              ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&j + 3));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_48,__n + 1,&local_60,
             (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&j + 3));
    std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
              ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&j + 3));
    std::vector<int,_std::allocator<int>_>::~vector(&local_60);
    std::allocator<int>::~allocator(&local_61);
    for (i_1 = 0; iVar2 = i_1, (ulong)(long)i_1 < __n + 1; i_1 = i_1 + 1) {
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_48,(long)i_1);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
      *pvVar5 = iVar2;
    }
    for (j_1 = 0; iVar2 = j_1,
        (undefined1 *)(long)j_1 <
        (undefined1 *)
        ((long)&((D.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start + 1U); j_1 = j_1 + 1) {
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_48,0);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)j_1);
      *pvVar5 = iVar2;
    }
    for (left = 1; (ulong)(long)left < __n + 1; left = left + 1) {
      for (down = 1;
          (undefined1 *)(long)down <
          (undefined1 *)
          ((long)&((D.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                  _M_start + 1U); down = down + 1) {
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_48,(long)(left + -1));
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)down);
        left_down = *pvVar5 + 1;
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_48,(long)left);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)(down + -1));
        local_90 = *pvVar5 + 1;
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_48,(long)(left + -1));
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)(down + -1));
        local_94 = *pvVar5;
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](s1,(long)(left + -1));
        cVar1 = *pvVar6;
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](s2,(long)(down + -1));
        if (cVar1 != *pvVar6) {
          local_94 = local_94 + 1;
        }
        piVar7 = std::min<int>(&local_90,&local_94);
        piVar7 = std::min<int>(&left_down,piVar7);
        iVar2 = *piVar7;
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_48,(long)left);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)down);
        *pvVar5 = iVar2;
      }
    }
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_48,__n);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (pvVar4,(size_type)
                               D.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    s1_local._4_4_ = *pvVar5;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_48);
  }
  return s1_local._4_4_;
}

Assistant:

int get_string_edit_distance(const std::string &s1, const std::string &s2)
  {
    std::size_t n = s1.size();
    std::size_t m = s2.size();
    if (n * m == 0) return static_cast<int>(n + m);
    std::vector<std::vector<int>> D(n + 1, std::vector<int>(m + 1));
    for (int i = 0; i < n + 1; i++)
    {
      D[i][0] = i;
    }
    for (int j = 0; j < m + 1; j++)
      D[0][j] = j;
    
    for (int i = 1; i < n + 1; i++)
    {
      for (int j = 1; j < m + 1; j++)
      {
        int left = D[i - 1][j] + 1;
        int down = D[i][j - 1] + 1;
        int left_down = D[i - 1][j - 1];
        if (s1[i - 1] != s2[j - 1]) left_down += 1;
        D[i][j] = (std::min)(left, (std::min)(down, left_down));
      }
    }
    return D[n][m];
  }